

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNABase::DataLoad(OPNABase *this,OPNABaseData *data)

{
  uint8 *puVar1;
  int local_1c;
  int i;
  OPNABaseData *data_local;
  OPNABase *this_local;
  
  OPNBase::DataLoad(&this->super_OPNBase,&data->opnbase);
  *(undefined4 *)this->pan = *(undefined4 *)data->pan;
  *(undefined2 *)(this->pan + 4) = *(undefined2 *)(data->pan + 4);
  *(undefined8 *)this->panvolume_l = *(undefined8 *)data->panvolume_l;
  *(undefined4 *)(this->panvolume_l + 4) = *(undefined4 *)(data->panvolume_l + 4);
  *(undefined8 *)this->panvolume_r = *(undefined8 *)data->panvolume_r;
  *(undefined4 *)(this->panvolume_r + 4) = *(undefined4 *)(data->panvolume_r + 4);
  *(undefined8 *)this->fnum2 = *(undefined8 *)data->fnum2;
  this->fnum2[8] = data->fnum2[8];
  this->reg22 = data->reg22;
  this->reg29 = data->reg29;
  this->stmask = data->stmask;
  this->statusnext = data->statusnext;
  this->lfocount = data->lfocount;
  this->lfodcount = data->lfodcount;
  *(undefined8 *)this->fnum = *(undefined8 *)data->fnum;
  *(undefined8 *)(this->fnum + 2) = *(undefined8 *)(data->fnum + 2);
  *(undefined8 *)(this->fnum + 4) = *(undefined8 *)(data->fnum + 4);
  *(undefined8 *)this->fnum3 = *(undefined8 *)data->fnum3;
  this->fnum3[2] = data->fnum3[2];
  if ((data->is_adpcmbuf & 1U) != 0) {
    if (this->adpcmbuf == (uint8 *)0x0) {
      puVar1 = (uint8 *)operator_new__(0x40000);
      this->adpcmbuf = puVar1;
    }
    memcpy(this->adpcmbuf,data->adpcmbuf,0x40000);
  }
  this->adpcmmask = data->adpcmmask;
  this->adpcmnotice = data->adpcmnotice;
  this->startaddr = data->startaddr;
  this->stopaddr = data->stopaddr;
  this->memaddr = data->memaddr;
  this->limitaddr = data->limitaddr;
  this->adpcmlevel = data->adpcmlevel;
  this->adpcmvolume = data->adpcmvolume;
  this->adpcmvol = data->adpcmvol;
  this->deltan = data->deltan;
  this->adplc = data->adplc;
  this->adpld = data->adpld;
  this->adplbase = data->adplbase;
  this->adpcmx = data->adpcmx;
  this->adpcmd = data->adpcmd;
  this->adpcmout = data->adpcmout;
  this->apout0 = data->apout0;
  this->apout1 = data->apout1;
  this->adpcmreadbuf = data->adpcmreadbuf;
  this->adpcmplay = (bool)(data->adpcmplay & 1);
  this->granuality = data->granuality;
  this->control1 = data->control1;
  this->control2 = data->control2;
  *(undefined8 *)this->adpcmreg = *(undefined8 *)data->adpcmreg;
  this->rhythmmask_ = data->rhythmmask_;
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    Channel4::DataLoad((Channel4 *)(this->adpcmreg + (long)local_1c * 0x2e0 + 0xf),
                       data->ch + local_1c);
    Channel4::SetChip((Channel4 *)(this->adpcmreg + (long)local_1c * 0x2e0 + 0xf),
                      &(this->super_OPNBase).chip);
  }
  return;
}

Assistant:

void OPNABase::DataLoad(struct OPNABaseData* data) {
	OPNBase::DataLoad(&data->opnbase);
	memcpy(pan, data->pan, 6);
	memcpy(panvolume_l, data->panvolume_l, sizeof(uint16) * 6);
	memcpy(panvolume_r, data->panvolume_r, sizeof(uint16) * 6);
	memcpy(fnum2, data->fnum2, 9);
	reg22 = data->reg22;
	reg29 = data->reg29;
	stmask = data->stmask;
	statusnext = data->statusnext;
	lfocount = data->lfocount;
	lfodcount = data->lfodcount;
	memcpy(fnum, data->fnum, sizeof(uint) * 6);
	memcpy(fnum3, data->fnum3, sizeof(uint) * 3);
	if(data->is_adpcmbuf) {
		if(!adpcmbuf)
			adpcmbuf = new uint8[0x40000];
		memcpy(adpcmbuf, data->adpcmbuf, 0x40000);
	}
	adpcmmask = data->adpcmmask;
	adpcmnotice = data->adpcmnotice;
	startaddr = data->startaddr;
	stopaddr = data->stopaddr;
	memaddr = data->memaddr;
	limitaddr = data->limitaddr;
	adpcmlevel = data->adpcmlevel;
	adpcmvolume = data->adpcmvolume;
	adpcmvol = data->adpcmvol;
	deltan = data->deltan;
	adplc = data->adplc;
	adpld = data->adpld;
	adplbase = data->adplbase;
	adpcmx = data->adpcmx;
	adpcmd = data->adpcmd;
	adpcmout = data->adpcmout;
	apout0 = data->apout0;
	apout1 = data->apout1;
	adpcmreadbuf = data->adpcmreadbuf;
	adpcmplay = data->adpcmplay;
	granuality = data->granuality;
	control1 = data->control1;
	control2 = data->control2;
	memcpy(adpcmreg, data->adpcmreg, 8);
	rhythmmask_ = data->rhythmmask_;
	for(int i = 0; i < 6; i++) {
		ch[i].DataLoad(&data->ch[i]);
		ch[i].SetChip(&chip);
	}
}